

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O3

RGBUnboundedSpectrum pbrt::HairBxDF::SigmaAFromConcentration(Float ce,Float cp)

{
  undefined1 auVar1 [16];
  RGB local_28;
  RGBUnboundedSpectrum local_18;
  
  auVar1._0_4_ = ce * 0.419 + cp * 0.187;
  auVar1._4_4_ = ce * 0.697 + cp * 0.4;
  auVar1._8_4_ = ce * 0.0 + cp * 0.0;
  auVar1._12_4_ = ce * 0.0 + cp * 0.0;
  local_28.b = ce * 1.37 + cp * 1.05;
  local_28._0_8_ = vmovlps_avx(auVar1);
  RGBUnboundedSpectrum::RGBUnboundedSpectrum(&local_18,RGBColorSpace::sRGB,&local_28);
  return local_18;
}

Assistant:

SampledSpectrum DielectricInterfaceBxDF::f(Vector3f wo, Vector3f wi,
                                           TransportMode mode) const {
    if (mfDistrib.EffectivelySmooth())
        return SampledSpectrum(0);
    if (SameHemisphere(wo, wi)) {
        // Compute reflection at non-delta dielectric interface
        Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
        Vector3f wh = wi + wo;
        // Handle degenerate cases for microfacet reflection
        if (cosTheta_i == 0 || cosTheta_o == 0)
            return SampledSpectrum(0.);
        if (wh.x == 0 && wh.y == 0 && wh.z == 0)
            return SampledSpectrum(0.);
        wh = Normalize(wh);
        Float F = FrDielectric(Dot(wi, FaceForward(wh, Vector3f(0, 0, 1))), eta);
        return tint * SampledSpectrum(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F /
                                      (4 * cosTheta_i * cosTheta_o));

    } else {
        // Compute transmission at non-delta dielectric interface
        Float cosTheta_o = CosTheta(wo), cosTheta_i = CosTheta(wi);
        if (cosTheta_i == 0 || cosTheta_o == 0)
            return {};
        // Compute $\wh$ from $\wo$ and $\wi$ for microfacet transmission
        Float etap = CosTheta(wo) > 0 ? eta : (1 / eta);
        Vector3f wh = wo + wi * etap;
        CHECK_RARE(1e-5f, LengthSquared(wh) == 0);
        if (LengthSquared(wh) == 0)
            return {};
        wh = FaceForward(Normalize(wh), Normal3f(0, 0, 1));

        // Return no transmission if _wi_ and _wo_ are on the same side of _wh_
        if (Dot(wi, wh) * Dot(wo, wh) > 0)
            return {};

        // Evaluate BTDF for transmission through microfacet interface
        Float F = FrDielectric(Dot(wo, wh), eta);
        Float sqrtDenom = Dot(wo, wh) + etap * Dot(wi, wh);
        Float factor = (mode == TransportMode::Radiance) ? Sqr(1 / etap) : 1;
        return tint *
               SampledSpectrum((1 - F) * factor *
                               std::abs(mfDistrib.D(wh) * mfDistrib.G(wo, wi) *
                                        AbsDot(wi, wh) * AbsDot(wo, wh) /
                                        (cosTheta_i * cosTheta_o * Sqr(sqrtDenom))));
    }
}